

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateTest.hpp
# Opt level: O2

void Qentem::Test::TestLoopTag1(QTest *test)

{
  StringStream<char> *pSVar1;
  Value<char> *pVVar2;
  Value<char> value1;
  Value<char> local_88;
  Value<char> value2;
  StringStream<char> ss;
  Value<char> value3;
  
  value1.type_ = Undefined;
  ss.storage_ = (char *)0x0;
  ss.length_ = 0;
  ss.capacity_ = 0;
  value1.field_0.array_.storage_ = (Value<char> *)0x0;
  value1.field_0._8_8_ = 0;
  value3.type_ = Undefined;
  value3.field_0.array_.storage_ = (Value<char> *)0x0;
  value3.field_0._8_8_ = 0;
  Value<char>::operator+=(&value1,100);
  Value<char>::operator+=(&value1,-0x32);
  Value<char>::operator+=(&value1,"Qentem");
  Value<char>::operator+=(&value1,true);
  Value<char>::operator+=(&value1,false);
  Value<char>::operator+=(&value1,(NullType)0x0);
  Value<char>::operator+=(&value1,3);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"loop1-value\">{var:loop1-value}, </loop>",&value1,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[41]>
            (test,pSVar1,(char (*) [41])"100, -50, Qentem, true, false, null, 3, ",0xb1a);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value    =    \"loop1-value\">{var:loop1-value}, {var:loop1-value} </loop>"
                      ,&value1,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[74]>
            (test,pSVar1,
             (char (*) [74])
             "100, 100 -50, -50 Qentem, Qentem true, true false, false null, null 3, 3 ",0xb1f);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value1);
  Value<char>::operator+=(&value1,0);
  Value<char>::operator+=(&value1,1);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"loop1-value\"><loop value=\"loop2-value\">({var:loop1-value}: {var:loop2-value}) </loop></loop>"
                      ,&value1,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[29]>
            (test,pSVar1,(char (*) [29])"(0: 0) (0: 1) (1: 0) (1: 1) ",0xb2a);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"loop1-value\"><loop value=\"loop2-value\"><loop\n                 value=\"loop3-value\">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>"
                      ,&value1,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[81]>
            (test,pSVar1,
             (char (*) [81])
             "(0: 0: 0) (0: 0: 1) (0: 1: 0) (0: 1: 1) (1: 0: 0) (1: 0: 1) (1: 1: 0) (1: 1: 1) ",
             0xb30);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\'loop1-value\'><loop value=\'loop2-value\'><loop\n                 value=\'loop3-value\'><loop value=\'loop4-value\'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>"
                      ,&value1,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[209]>
            (test,pSVar1,
             (char (*) [209])
             "(0: 0: 0: 0) (0: 0: 0: 1) (0: 0: 1: 0) (0: 0: 1: 1) (0: 1: 0: 0) (0: 1: 0: 1) (0: 1: 1: 0) (0: 1: 1: 1) (1: 0: 0: 0) (1: 0: 0: 1) (1: 0: 1: 0) (1: 0: 1: 1) (1: 1: 0: 0) (1: 1: 0: 1) (1: 1: 1: 0) (1: 1: 1: 1) "
             ,0xb38);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  JSON::Parse<char>(&value2,"[100, -50, \"A\", true, false, null]");
  Value<char>::operator=(&value1,&value2);
  Value<char>::~Value(&value2);
  JSON::Parse<char>(&value2,
                    "{\"k-1\": 4, \"k-2\":1.5, \"k-3\":\"ABC\", \"k-4\":true, \"k-5\":false, \"k-6\":null}"
                   );
  pVVar2 = Value<char>::operator[](&value3,"arr1");
  Value<char>::operator=(pVVar2,&value1);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"loop1-value\">{var:loop1-value}, </loop>",&value1,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (test,pSVar1,(char (*) [33])"100, -50, A, true, false, null, ",0xb45);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"loop1-value\">{var:loop1-value}, </loop>",&value2,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (test,pSVar1,(char (*) [33])"4, 1.5, ABC, true, false, null, ",0xb49);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>",&value3,
                      &ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (test,pSVar1,(char (*) [33])"100, -50, A, true, false, null, ",0xb4d);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pVVar2 = Value<char>::operator[](&value3,"arr1");
  Value<char>::operator=(pVVar2,&value2);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>",&value3,
                      &ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (test,pSVar1,(char (*) [33])"4, 1.5, ABC, true, false, null, ",0xb53);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pVVar2 = Value<char>::operator[](&value3,"arr1");
  Value<char>::operator=(pVVar2,&value1);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"loop1-value\" >{var:loop1-value}, </loop>",&value1,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (test,pSVar1,(char (*) [33])"100, -50, A, true, false, null, ",0xb5a);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"loop1-value\">{var:loop1-value}, </loop>",&value2,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (test,pSVar1,(char (*) [33])"4, 1.5, ABC, true, false, null, ",0xb5e);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"loop1-value\"set=\"arr1\">{var:loop1-value}, </loop>",&value3,
                      &ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (test,pSVar1,(char (*) [33])"100, -50, A, true, false, null, ",0xb62);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pVVar2 = Value<char>::operator[](&value3,"arr1");
  Value<char>::operator=(pVVar2,&value2);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop set=\'arr1\' value=\"loop1-value\">{var:loop1-value}, </loop>",&value3,
                      &ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (test,pSVar1,(char (*) [33])"4, 1.5, ABC, true, false, null, ",0xb68);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value3);
  pVVar2 = Value<char>::operator[](&value3,"arr1");
  pVVar2 = Value<char>::operator[](pVVar2,"arr2");
  pVVar2 = Value<char>::operator[](pVVar2,"arr3");
  Value<char>::operator=(pVVar2,&value1);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop set=\"arr1[arr2][arr3]\" value=\"loop1-value\">{var:loop1-value}, </loop>"
                      ,&value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (test,pSVar1,(char (*) [33])"100, -50, A, true, false, null, ",0xb70);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value3);
  pVVar2 = Value<char>::operator[](&value3,0);
  pVVar2 = Value<char>::operator[](pVVar2,0);
  Value<char>::operator+=(pVVar2,&value2);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop set=\"0[0][0]\"value=\"loop1-value\">{var:loop1-value}, </loop>",
                      &value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (test,pSVar1,(char (*) [33])"4, 1.5, ABC, true, false, null, ",0xb77);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value3);
  pVVar2 = Value<char>::operator[](&value3,"k1");
  pVVar2 = Value<char>::operator[](pVVar2,0);
  pVVar2 = Value<char>::operator[](pVVar2,"k3");
  Value<char>::operator=(pVVar2,&value1);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"loop1-value\" set=\"k1[0][k3]\">{var:loop1-value}, </loop>",
                      &value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (test,pSVar1,(char (*) [33])"100, -50, A, true, false, null, ",0xb7e);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value3);
  pVVar2 = Value<char>::operator[](&value3,0);
  pVVar2 = Value<char>::operator[](pVVar2,"k2");
  Value<char>::operator+=(pVVar2,&value2);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop set=\"0[k2][0]\"value=\"loop1-value\">{var:loop1-value}, {var:loop1-value}, </loop>"
                      ,&value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[65]>
            (test,pSVar1,
             (char (*) [65])"4, 4, 1.5, 1.5, ABC, ABC, true, true, false, false, null, null, ",0xb86
            );
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  JSON::Parse<char>(&local_88,"{\"group\":[[10],[20],[30]]}");
  Value<char>::operator=(&value3,&local_88);
  Value<char>::~Value(&local_88);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop set=\"group\" value=\"Val_1\"><loop set=\"Val_1\" value=\"Val_2\">{var:Val_2}</loop></loop>"
                      ,&value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar1,(char (*) [7])"102030",0xb8c);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  JSON::Parse<char>(&local_88,"{\"group\":[1,2,3,4]}");
  Value<char>::operator=(&value3,&local_88);
  Value<char>::~Value(&local_88);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop set=\"group\" value=\"Val_\">{var:Val_}</loop>",&value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(test,pSVar1,(char (*) [5])"1234",0xb92);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  JSON::Parse<char>(&local_88,"{\"numbers\":[1,2,3,4,5,6,7,8]}");
  Value<char>::operator=(&value3,&local_88);
  Value<char>::~Value(&local_88);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("A<loop set=\"numbers\" value=\"l_id1\">{var:l_id1}</loop>B",&value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>(test,pSVar1,(char (*) [11])"A12345678B",0xb97)
  ;
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop set=\"numbers\" value=\"l_id1\">{var:l_id1[0]}</loop>",&value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[113]>
            (test,pSVar1,
             (char (*) [113])
             "{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}"
             ,0xb9e);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::~Value(&value2);
  Value<char>::~Value(&value3);
  Value<char>::~Value(&value1);
  Memory::Deallocate(ss.storage_);
  return;
}

Assistant:

static void TestLoopTag1(QTest &test) {
    StringStream<char> ss;
    Value<char>        value1;
    Value<char>        value3;
    const char        *content;

    value1 += 100;
    value1 += -50;
    value1 += R"(Qentem)";
    value1 += true;
    value1 += false;
    value1 += nullptr;
    value1 += 3;

    content = R"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), R"(100, -50, Qentem, true, false, null, 3, )", __LINE__);
    ss.Clear();

    content = R"(<loop value    =    "loop1-value">{var:loop1-value}, {var:loop1-value} </loop>)";
    test.IsEqual(Template::Render(content, value1, ss),
                 R"(100, 100 -50, -50 Qentem, Qentem true, true false, false null, null 3, 3 )", __LINE__);
    ss.Clear();

    ////////////////

    value1.Reset();
    value1 += 0;
    value1 += 1;

    content =
        R"(<loop value="loop1-value"><loop value="loop2-value">({var:loop1-value}: {var:loop2-value}) </loop></loop>)";
    test.IsEqual(Template::Render(content, value1, ss), R"((0: 0) (0: 1) (1: 0) (1: 1) )", __LINE__);
    ss.Clear();

    content = R"(<loop value="loop1-value"><loop value="loop2-value"><loop
                 value="loop3-value">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>)";
    test.IsEqual(Template::Render(content, value1, ss),
                 R"((0: 0: 0) (0: 0: 1) (0: 1: 0) (0: 1: 1) (1: 0: 0) (1: 0: 1) (1: 1: 0) (1: 1: 1) )", __LINE__);
    ss.Clear();

    content = R"(<loop value='loop1-value'><loop value='loop2-value'><loop
                 value='loop3-value'><loop value='loop4-value'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>)";
    test.IsEqual(
        Template::Render(content, value1, ss),
        R"((0: 0: 0: 0) (0: 0: 0: 1) (0: 0: 1: 0) (0: 0: 1: 1) (0: 1: 0: 0) (0: 1: 0: 1) (0: 1: 1: 0) (0: 1: 1: 1) (1: 0: 0: 0) (1: 0: 0: 1) (1: 0: 1: 0) (1: 0: 1: 1) (1: 1: 0: 0) (1: 1: 0: 1) (1: 1: 1: 0) (1: 1: 1: 1) )",
        __LINE__);
    ss.Clear();

    //////////////////////

    value1 = JSON::Parse(R"([100, -50, "A", true, false, null])");
    const Value<char> value2 =
        JSON::Parse(R"({"k-1": 4, "k-2":1.5, "k-3":"ABC", "k-4":true, "k-5":false, "k-6":null})");

    //////////////////////
    value3[R"(arr1)"] = value1;

    content = R"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), R"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    content = R"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value2, ss), R"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    content = R"(<loop set="arr1" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3[R"(arr1)"] = value2;

    content = R"(<loop set="arr1" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    //////////////////////
    value3[R"(arr1)"] = value1;

    content = R"(<loop value="loop1-value" >{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), R"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    content = R"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value2, ss), R"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    content = R"(<loop value="loop1-value"set="arr1">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3[R"(arr1)"] = value2;

    content = R"(<loop set='arr1' value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    //////////////////////
    value3.Reset();
    value3[R"(arr1)"][R"(arr2)"][R"(arr3)"] = value1;

    content = R"(<loop set="arr1[arr2][arr3]" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[0][0] += value2;

    content = R"(<loop set="0[0][0]"value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[R"(k1)"][0][R"(k3)"] = value1;

    content = R"(<loop value="loop1-value" set="k1[0][k3]">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[0][R"(k2)"] += value2;

    content = R"(<loop set="0[k2][0]"value="loop1-value">{var:loop1-value}, {var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss),
                 R"(4, 4, 1.5, 1.5, ABC, ABC, true, true, false, false, null, null, )", __LINE__);
    ss.Clear();

    value3 = JSON::Parse(R"({"group":[[10],[20],[30]]})");

    content = R"(<loop set="group" value="Val_1"><loop set="Val_1" value="Val_2">{var:Val_2}</loop></loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(102030)", __LINE__);
    ss.Clear();

    value3 = JSON::Parse(R"({"group":[1,2,3,4]})");

    content = R"(<loop set="group" value="Val_">{var:Val_}</loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(1234)", __LINE__);
    ss.Clear();

    value3  = JSON::Parse(R"({"numbers":[1,2,3,4,5,6,7,8]})");
    content = R"(A<loop set="numbers" value="l_id1">{var:l_id1}</loop>B)";
    test.IsEqual(Template::Render(content, value3, ss), R"(A12345678B)", __LINE__);
    ss.Clear();

    content = R"(<loop set="numbers" value="l_id1">{var:l_id1[0]}</loop>)";
    test.IsEqual(
        Template::Render(content, value3, ss),
        R"({var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]})",
        __LINE__);
    ss.Clear();
}